

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O1

int Abc_NtkRR(Abc_Ntk_t *pNtk,int nFaninLevels,int nFanoutLevels,int fUseFanouts,int fVerbose)

{
  void *pvVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Abc_RRMan_t *p;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Prove_Params_t *pParams;
  Abc_Obj_t *pAVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int level;
  char *__assertion;
  Abc_Ntk_t *pNtk_00;
  timespec ts;
  timespec local_78;
  double local_68;
  Abc_Ntk_t *local_60;
  int local_58;
  int local_54;
  long local_50;
  ProgressBar *local_48;
  long local_40;
  long local_38;
  
  local_60 = pNtk;
  local_58 = fVerbose;
  local_54 = fUseFanouts;
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  p = (Abc_RRMan_t *)malloc(0xa0);
  memset(p,0,0xa0);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  p->vFaninLeaves = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  p->vFanoutRoots = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  p->vLeaves = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  p->vCone = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  p->vRoots = pVVar8;
  pParams = (Prove_Params_t *)malloc(0x58);
  p->pParams = pParams;
  pParams->fUseFraiging = 0;
  pParams->fUseRewriting = 0;
  pParams->fUseBdds = 0;
  pParams->fVerbose = 0;
  pParams->nItersMax = 0;
  pParams->nMiteringLimitStart = 0;
  pParams->nMiteringLimitMulti = 0.0;
  pParams->nRewritingLimitStart = 0;
  pParams->nRewritingLimitMulti = 0.0;
  pParams->nFraigingLimitStart = 0;
  pParams->nFraigingLimitMulti = 0.0;
  pParams->nBddSizeLimit = 0;
  pParams->fBddReorder = 0;
  pParams->nMiteringLimitLast = 0;
  pParams->nTotalBacktrackLimit = 0;
  pParams->nTotalInspectLimit = 0;
  pParams->nTotalBacktracksMade = 0;
  pParams->nTotalInspectsMade = 0;
  Prove_ParamsSetDefault(pParams);
  pNtk_00 = local_60;
  p->pNtk = local_60;
  p->nFaninLevels = nFaninLevels;
  p->nFanoutLevels = nFanoutLevels;
  p->nNodesOld = local_60->nObjCounts[7];
  iVar5 = Abc_AigLevel(local_60);
  p->nLevelsOld = iVar5;
  Abc_NtkCleanCopy(pNtk_00);
  local_40 = (long)pNtk_00->vObjs->nSize;
  pAVar10 = Abc_AigConst1(pNtk_00);
  pAVar10->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0xffffffff;
  pVVar8 = pNtk_00->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar11];
      iVar5 = rand();
      iVar6 = rand();
      uVar7 = rand();
      *(ulong *)((long)pvVar1 + 0x38) = (ulong)(uVar7 ^ iVar6 << 0xc ^ iVar5 << 0x18);
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk_00->vCis;
    } while (lVar11 < pVVar8->nSize);
  }
  pVVar8 = pNtk_00->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar11];
      if (((plVar2 != (long *)0x0) && (lVar11 != 0)) &&
         (uVar7 = *(uint *)((long)plVar2 + 0x14), (uVar7 & 0xf) == 7)) {
        if (plVar2[7] != 0) {
          __assert_fail("pObj->pData == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                        ,0x2e8,"void Abc_NtkRRSimulateStart(Abc_Ntk_t *)");
        }
        lVar12 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        plVar2[7] = (ulong)(((int)(uVar7 << 0x14) >> 0x1f ^
                            *(uint *)(*(long *)(lVar12 + (long)((int *)plVar2[4])[1] * 8) + 0x38)) &
                           ((int)(uVar7 << 0x15) >> 0x1f ^
                           *(uint *)(*(long *)(lVar12 + (long)*(int *)plVar2[4] * 8) + 0x38)));
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk_00->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  local_48 = Extra_ProgressBarStart(_stdout,(int)local_40);
  pVVar8 = pNtk_00->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pAVar10 = (Abc_Obj_t *)pVVar8->pArray[lVar11];
      local_38 = lVar11;
      if ((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) {
        if ((local_48 == (ProgressBar *)0x0) || (local_48->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(local_48,(int)lVar11,(char *)0x0);
        }
        if (local_40 <= lVar11) break;
        if (((ulong)pAVar10 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0029d6d3:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (pAVar10->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0029d6d3;
        }
        if ((pAVar10->vFanins).nSize != 2) {
          __assert_fail("Abc_AigNodeIsAnd(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x192,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
        }
        if (((pAVar10->field_0x15 & 2) == 0) && ((pAVar10->vFanouts).nSize < 0x3e9)) {
          iVar5 = (pAVar10->vFanins).nSize;
          if (local_54 == 0) {
            if (0 < iVar5) {
              lVar11 = 0;
              do {
                pAVar3 = (Abc_Obj_t *)
                         pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar11]];
                if ((pAVar3->vFanouts).nSize != 1) {
                  p->nEdgesTried = p->nEdgesTried + 1;
                  Abc_RRManClean(p);
                  p->pNode = pAVar10;
                  p->pFanin = pAVar3;
                  p->pFanout = (Abc_Obj_t *)0x0;
                  iVar5 = clock_gettime(3,&local_78);
                  if (iVar5 < 0) {
                    lVar12 = 1;
                  }
                  else {
                    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
                  }
                  iVar5 = Abc_NtkRRWindow(p);
                  iVar6 = clock_gettime(3,&local_78);
                  if (iVar6 < 0) {
                    lVar13 = -1;
                  }
                  else {
                    lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                  }
                  p->timeWindow = p->timeWindow + lVar13 + lVar12;
                  if (iVar5 != 0) {
                    iVar5 = clock_gettime(3,&local_78);
                    if (iVar5 < 0) {
                      lVar12 = 1;
                    }
                    else {
                      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                      lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
                    }
                    iVar5 = Abc_NtkRRProve(p);
                    iVar6 = clock_gettime(3,&local_78);
                    if (iVar6 < 0) {
                      lVar13 = -1;
                    }
                    else {
                      lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                    }
                    p->timeMiter = p->timeMiter + lVar13 + lVar12;
                    if (iVar5 != 0) {
                      iVar5 = clock_gettime(3,&local_78);
                      if (iVar5 < 0) {
                        lVar11 = 1;
                      }
                      else {
                        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                        lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
                      }
                      Abc_NtkRRUpdate(pNtk_00,p->pNode,p->pFanin,p->pFanout);
                      iVar5 = clock_gettime(3,&local_78);
                      if (iVar5 < 0) {
                        lVar12 = -1;
                      }
                      else {
                        lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                      }
                      p->timeUpdate = p->timeUpdate + lVar12 + lVar11;
                      p->nEdgesRemoved = p->nEdgesRemoved + 1;
                      break;
                    }
                  }
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < (pAVar10->vFanins).nSize);
            }
          }
          else if (0 < iVar5) {
            local_68 = 0.0;
            do {
              if (0 < (pAVar10->vFanouts).nSize) {
                pAVar3 = (Abc_Obj_t *)
                         pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[(long)local_68]];
                lVar11 = 0;
                do {
                  pAVar4 = (Abc_Obj_t *)
                           pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanouts).pArray[lVar11]];
                  p->nEdgesTried = p->nEdgesTried + 1;
                  Abc_RRManClean(p);
                  p->pNode = pAVar10;
                  p->pFanin = pAVar3;
                  p->pFanout = pAVar4;
                  iVar5 = clock_gettime(3,&local_78);
                  if (iVar5 < 0) {
                    lVar12 = 1;
                  }
                  else {
                    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
                  }
                  iVar5 = Abc_NtkRRWindow(p);
                  iVar6 = clock_gettime(3,&local_78);
                  if (iVar6 < 0) {
                    lVar13 = -1;
                  }
                  else {
                    lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                  }
                  p->timeWindow = p->timeWindow + lVar13 + lVar12;
                  if (iVar5 != 0) {
                    iVar5 = clock_gettime(3,&local_78);
                    if (iVar5 < 0) {
                      lVar12 = 1;
                    }
                    else {
                      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                      lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
                    }
                    iVar5 = Abc_NtkRRProve(p);
                    iVar6 = clock_gettime(3,&local_78);
                    if (iVar6 < 0) {
                      lVar13 = -1;
                    }
                    else {
                      lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                    }
                    p->timeMiter = p->timeMiter + lVar13 + lVar12;
                    if (iVar5 != 0) {
                      iVar5 = clock_gettime(3,&local_78);
                      if (iVar5 < 0) {
                        lVar11 = 1;
                      }
                      else {
                        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
                        lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
                      }
                      Abc_NtkRRUpdate(local_60,p->pNode,p->pFanin,p->pFanout);
                      iVar5 = clock_gettime(3,&local_78);
                      if (iVar5 < 0) {
                        lVar12 = -1;
                      }
                      else {
                        lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
                      }
                      p->timeUpdate = p->timeUpdate + lVar12 + lVar11;
                      p->nEdgesRemoved = p->nEdgesRemoved + 1;
                      break;
                    }
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (pAVar10->vFanouts).nSize);
              }
              local_68 = (double)((long)local_68 + 1);
              pNtk_00 = local_60;
            } while ((long)local_68 < (long)(pAVar10->vFanins).nSize);
          }
        }
      }
      lVar11 = local_38 + 1;
      pVVar8 = pNtk_00->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  pVVar8 = pNtk_00->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      if (pVVar8->pArray[lVar11] != (void *)0x0) {
        *(undefined8 *)((long)pVVar8->pArray[lVar11] + 0x38) = 0;
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk_00->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  Extra_ProgressBarStop(local_48);
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  p->timeTotal = lVar11 + local_50;
  if (local_58 != 0) {
    local_68 = ((double)(p->nNodesOld - p->pNtk->nObjCounts[7]) * 100.0) / (double)p->nNodesOld;
    puts("Redundancy removal statistics:");
    printf("Edges tried     = %6d.\n",(ulong)(uint)p->nEdgesTried);
    printf("Edges removed   = %6d. (%5.2f %%)\n",
           SUB84(((double)p->nEdgesRemoved * 100.0) / (double)p->nEdgesTried,0));
    printf("Node gain       = %6d. (%5.2f %%)\n",SUB84(local_68,0),
           (ulong)(uint)(p->nNodesOld - p->pNtk->nObjCounts[7]));
    iVar5 = p->nLevelsOld;
    iVar6 = Abc_AigLevel(p->pNtk);
    level = 0x827b91;
    printf("Level gain      = %6d.\n",(ulong)(uint)(iVar5 - iVar6));
    Abc_Print(level,"%s =","Windowing      ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)p->timeWindow / 1000000.0,0));
    Abc_Print(level,"%s =","Miter          ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)p->timeMiter / 1000000.0,0));
    Abc_Print(level,"%s =","    Construct  ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)(p->timeMiter - p->timeProve) / 1000000.0,0));
    Abc_Print(level,"%s =","    Prove      ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)p->timeProve / 1000000.0,0));
    Abc_Print(level,"%s =","Update         ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)p->timeUpdate / 1000000.0,0));
    pNtk_00 = local_60;
    Abc_Print(level,"%s =","TOTAL          ");
    Abc_Print(level,"%9.2f sec\n",SUB84((double)p->timeTotal / 1000000.0,0));
  }
  Abc_RRManClean(p);
  pVVar8 = p->vFaninLeaves;
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = p->vFanoutRoots;
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = p->vLeaves;
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = p->vCone;
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = p->vRoots;
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  if (p->pParams != (Prove_Params_t *)0x0) {
    free(p->pParams);
    p->pParams = (Prove_Params_t *)0x0;
  }
  free(p);
  Abc_NtkReassignIds(pNtk_00);
  Abc_NtkLevel(pNtk_00);
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    puts("Abc_NtkRR: The network check has failed.");
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int Abc_NtkRR( Abc_Ntk_t * pNtk, int nFaninLevels, int nFanoutLevels, int fUseFanouts, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_RRMan_t * p;
    Abc_Obj_t * pNode, * pFanin, * pFanout;
    int i, k, m, nNodes, RetValue;
    abctime clk, clkTotal = Abc_Clock();
    // start the manager
    p = Abc_RRManStart();
    p->pNtk          = pNtk;
    p->nFaninLevels  = nFaninLevels;
    p->nFanoutLevels = nFanoutLevels;
    p->nNodesOld     = Abc_NtkNodeNum(pNtk);
    p->nLevelsOld    = Abc_AigLevel(pNtk);
    // remember latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pNext = pNode->pData;
    // go through the nodes
    Abc_NtkCleanCopy(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    Abc_NtkRRSimulateStart(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // construct the window
        if ( !fUseFanouts )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
            {
                // skip the nodes with only one fanout (tree nodes)
                if ( Abc_ObjFanoutNum(pFanin) == 1 )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    int k = 0;
                }
*/
                p->nEdgesTried++;
                Abc_RRManClean( p );
                p->pNode   = pNode;
                p->pFanin  = pFanin;
                p->pFanout = NULL;

                clk = Abc_Clock();
                RetValue = Abc_NtkRRWindow( p );
                p->timeWindow += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    Abc_NtkShowAig( p->pWnd, 0 );
                }
*/
                clk = Abc_Clock();
                RetValue = Abc_NtkRRProve( p );
                p->timeMiter += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
//printf( "%d -> %d (%d)\n", pFanin->Id, pNode->Id, k );

                clk = Abc_Clock();
                Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
                p->timeUpdate += Abc_Clock() - clk;

                p->nEdgesRemoved++;
                break;
            }
            continue;
        }
        // use the fanouts
        Abc_ObjForEachFanin( pNode, pFanin, k )
        Abc_ObjForEachFanout( pNode, pFanout, m )
        {
            // skip the nodes with only one fanout (tree nodes)
//            if ( Abc_ObjFanoutNum(pFanin) == 1 && Abc_ObjFanoutNum(pNode) == 1 )
//                continue;

            p->nEdgesTried++;
            Abc_RRManClean( p );
            p->pNode   = pNode;
            p->pFanin  = pFanin;
            p->pFanout = pFanout;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRWindow( p );
            p->timeWindow += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRProve( p );
            p->timeMiter += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
            p->timeUpdate += Abc_Clock() - clk;

            p->nEdgesRemoved++;
            break;
        }
    }
    Abc_NtkRRSimulateStop(pNtk);
    Extra_ProgressBarStop( pProgress );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Abc_RRManPrintStats( p );
    Abc_RRManStop( p );
    // restore latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pData = pNode->pNext, pNode->pNext = NULL;
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
    Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRR: The network check has failed.\n" );
        return 0;
    }
    return 1;
}